

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_libapi.cpp
# Opt level: O0

ze_result_t
zeMemOpenIpcHandle(ze_context_handle_t hContext,ze_device_handle_t hDevice,
                  ze_ipc_mem_handle_t handle,ze_ipc_memory_flags_t flags,void **pptr)

{
  ze_pfnMemOpenIpcHandle_t p_Var1;
  ze_ipc_mem_handle_t zVar2;
  ze_device_handle_t p_Var3;
  ze_device_handle_t p_Var4;
  __pointer_type p_Var5;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  ze_pfnMemOpenIpcHandle_t local_38;
  ze_pfnMemOpenIpcHandle_t pfnOpenIpcHandle;
  void **pptr_local;
  ze_device_handle_t p_Stack_20;
  ze_ipc_memory_flags_t flags_local;
  ze_device_handle_t hDevice_local;
  ze_context_handle_t hContext_local;
  
  if ((ze_lib::destruction & 1) == 0) {
    pfnOpenIpcHandle = (ze_pfnMemOpenIpcHandle_t)pptr;
    pptr_local._4_4_ = flags;
    p_Stack_20 = hDevice;
    hDevice_local = (ze_device_handle_t)hContext;
    p_Var5 = std::atomic<_ze_dditable_t_*>::load
                       ((atomic<_ze_dditable_t_*> *)(ze_lib::context + 0x10),memory_order_seq_cst);
    p_Var4 = hDevice_local;
    p_Var3 = p_Stack_20;
    p_Var1 = (p_Var5->Mem).pfnOpenIpcHandle;
    if (p_Var1 == (ze_pfnMemOpenIpcHandle_t)0x0) {
      if ((*(byte *)(ze_lib::context + 0xd90) & 1) == 0) {
        hContext_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
      }
      else {
        hContext_local._4_4_ = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
      }
    }
    else {
      local_38 = p_Var1;
      memcpy(&local_78,&handle,0x40);
      zVar2.data[8] = (undefined1)uStack_70;
      zVar2.data[9] = uStack_70._1_1_;
      zVar2.data[10] = uStack_70._2_1_;
      zVar2.data[0xb] = uStack_70._3_1_;
      zVar2.data[0xc] = uStack_70._4_1_;
      zVar2.data[0xd] = uStack_70._5_1_;
      zVar2.data[0xe] = uStack_70._6_1_;
      zVar2.data[0xf] = uStack_70._7_1_;
      zVar2.data[0] = (undefined1)local_78;
      zVar2.data[1] = local_78._1_1_;
      zVar2.data[2] = local_78._2_1_;
      zVar2.data[3] = local_78._3_1_;
      zVar2.data[4] = local_78._4_1_;
      zVar2.data[5] = local_78._5_1_;
      zVar2.data[6] = local_78._6_1_;
      zVar2.data[7] = local_78._7_1_;
      zVar2.data[0x10] = (undefined1)local_68;
      zVar2.data[0x11] = local_68._1_1_;
      zVar2.data[0x12] = local_68._2_1_;
      zVar2.data[0x13] = local_68._3_1_;
      zVar2.data[0x14] = local_68._4_1_;
      zVar2.data[0x15] = local_68._5_1_;
      zVar2.data[0x16] = local_68._6_1_;
      zVar2.data[0x17] = local_68._7_1_;
      zVar2.data[0x18] = (undefined1)uStack_60;
      zVar2.data[0x19] = uStack_60._1_1_;
      zVar2.data[0x1a] = uStack_60._2_1_;
      zVar2.data[0x1b] = uStack_60._3_1_;
      zVar2.data[0x1c] = uStack_60._4_1_;
      zVar2.data[0x1d] = uStack_60._5_1_;
      zVar2.data[0x1e] = uStack_60._6_1_;
      zVar2.data[0x1f] = uStack_60._7_1_;
      zVar2.data[0x20] = (undefined1)local_58;
      zVar2.data[0x21] = local_58._1_1_;
      zVar2.data[0x22] = local_58._2_1_;
      zVar2.data[0x23] = local_58._3_1_;
      zVar2.data[0x24] = local_58._4_1_;
      zVar2.data[0x25] = local_58._5_1_;
      zVar2.data[0x26] = local_58._6_1_;
      zVar2.data[0x27] = local_58._7_1_;
      zVar2.data[0x28] = (undefined1)uStack_50;
      zVar2.data[0x29] = uStack_50._1_1_;
      zVar2.data[0x2a] = uStack_50._2_1_;
      zVar2.data[0x2b] = uStack_50._3_1_;
      zVar2.data[0x2c] = uStack_50._4_1_;
      zVar2.data[0x2d] = uStack_50._5_1_;
      zVar2.data[0x2e] = uStack_50._6_1_;
      zVar2.data[0x2f] = uStack_50._7_1_;
      zVar2.data[0x30] = (undefined1)local_48;
      zVar2.data[0x31] = local_48._1_1_;
      zVar2.data[0x32] = local_48._2_1_;
      zVar2.data[0x33] = local_48._3_1_;
      zVar2.data[0x34] = local_48._4_1_;
      zVar2.data[0x35] = local_48._5_1_;
      zVar2.data[0x36] = local_48._6_1_;
      zVar2.data[0x37] = local_48._7_1_;
      zVar2.data[0x38] = (undefined1)uStack_40;
      zVar2.data[0x39] = uStack_40._1_1_;
      zVar2.data[0x3a] = uStack_40._2_1_;
      zVar2.data[0x3b] = uStack_40._3_1_;
      zVar2.data[0x3c] = uStack_40._4_1_;
      zVar2.data[0x3d] = uStack_40._5_1_;
      zVar2.data[0x3e] = uStack_40._6_1_;
      zVar2.data[0x3f] = uStack_40._7_1_;
      hContext_local._4_4_ =
           (*p_Var1)((ze_context_handle_t)p_Var4,p_Var3,zVar2,pptr_local._4_4_,
                     (void **)pfnOpenIpcHandle);
    }
  }
  else {
    hContext_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  return hContext_local._4_4_;
}

Assistant:

ze_result_t ZE_APICALL
zeMemOpenIpcHandle(
    ze_context_handle_t hContext,                   ///< [in] handle of the context object
    ze_device_handle_t hDevice,                     ///< [in] handle of the device to associate with the IPC memory handle
    ze_ipc_mem_handle_t handle,                     ///< [in] IPC memory handle
    ze_ipc_memory_flags_t flags,                    ///< [in] flags controlling the operation.
                                                    ///< must be 0 (default) or a valid combination of ::ze_ipc_memory_flag_t.
    void** pptr                                     ///< [out] pointer to device allocation in this process
    )
{
    #ifdef DYNAMIC_LOAD_LOADER
    ze_result_t result = ZE_RESULT_SUCCESS;
    if(ze_lib::destruction) {
        return ZE_RESULT_ERROR_UNINITIALIZED;
    }
    static const ze_pfnMemOpenIpcHandle_t pfnOpenIpcHandle = [&result] {
        auto pfnOpenIpcHandle = ze_lib::context->zeDdiTable.load()->Mem.pfnOpenIpcHandle;
        if( nullptr == pfnOpenIpcHandle ) {
            result = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
        }
        return pfnOpenIpcHandle;
    }();
    if (result != ZE_RESULT_SUCCESS) {
        return result;
    }
    return pfnOpenIpcHandle( hContext, hDevice, handle, flags, pptr );
    #else
    if(ze_lib::destruction) {
        return ZE_RESULT_ERROR_UNINITIALIZED;
    }

    auto pfnOpenIpcHandle = ze_lib::context->zeDdiTable.load()->Mem.pfnOpenIpcHandle;
    if( nullptr == pfnOpenIpcHandle ) {
        if(!ze_lib::context->isInitialized)
            return ZE_RESULT_ERROR_UNINITIALIZED;
        else
            return ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
    }

    return pfnOpenIpcHandle( hContext, hDevice, handle, flags, pptr );
    #endif
}